

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O0

ON_2dVector __thiscall ON_Ellipse::GradientAt(ON_Ellipse *this,ON_2dPoint *p)

{
  ON_2dVector OVar1;
  ON_2dPoint *p_local;
  ON_Ellipse *this_local;
  ON_2dVector g;
  
  if (((this->radius[0] == 0.0) && (!NAN(this->radius[0]))) ||
     ((this->radius[1] == 0.0 && (!NAN(this->radius[1]))))) {
    this_local = (ON_Ellipse *)ON_2dVector::ZeroVector.x;
    g.x = ON_2dVector::ZeroVector.y;
  }
  else {
    this_local = (ON_Ellipse *)((p->x * 2.0) / (this->radius[0] * this->radius[0]));
    g.x = (p->y * 2.0) / (this->radius[1] * this->radius[1]);
  }
  OVar1.y = g.x;
  OVar1.x = (double)this_local;
  return OVar1;
}

Assistant:

ON_2dVector ON_Ellipse::GradientAt( 
                 const ON_2dPoint& p // coordinates in plane
                 ) const
{
  ON_2dVector g;
  if ( radius[0] != 0.0 && radius[1] != 0.0 ) {
    g.x = 2.0*p.x/(radius[0]*radius[0]);
    g.y = 2.0*p.y/(radius[1]*radius[1]);
  }
  else {
    g = ON_2dVector::ZeroVector;
  }
  return g;
}